

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyFindBody(TidyDocImpl *doc)

{
  Dict *pDVar1;
  Node *pNVar2;
  
  if (doc == (TidyDocImpl *)0x0) {
    pNVar2 = (Node *)0x0;
  }
  else {
    pNVar2 = (doc->root).content;
  }
  while( true ) {
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_HTML)) break;
    pNVar2 = pNVar2->next;
  }
  pNVar2 = pNVar2->content;
  while( true ) {
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDVar1 = pNVar2->tag;
    if ((pDVar1 != (Dict *)0x0) &&
       ((pDVar1->id == TidyTag_BODY || ((pDVar1 != (Dict *)0x0 && (pDVar1->id == TidyTag_FRAMESET)))
        ))) break;
    pNVar2 = pNVar2->next;
  }
  if (pDVar1 == (Dict *)0x0) {
    return pNVar2;
  }
  if (pDVar1->id != TidyTag_FRAMESET) {
    return pNVar2;
  }
  pNVar2 = pNVar2->content;
  if (pNVar2 != (Node *)0x0) {
    while ((pNVar2->tag == (Dict *)0x0 || (pNVar2->tag->id != TidyTag_NOFRAMES))) {
      pNVar2 = pNVar2->next;
      if (pNVar2 == (Node *)0x0) {
        return (Node *)0x0;
      }
    }
    pNVar2 = pNVar2->content;
    if (pNVar2 != (Node *)0x0) {
      while ((pNVar2->tag == (Dict *)0x0 || (pNVar2->tag->id != TidyTag_BODY))) {
        pNVar2 = pNVar2->next;
        if (pNVar2 == (Node *)0x0) {
          return (Node *)0x0;
        }
      }
      return pNVar2;
    }
    return (Node *)0x0;
  }
  return (Node *)0x0;
}

Assistant:

Node *TY_(FindBody)( TidyDocImpl* doc )
{
    Node *node = ( doc ? doc->root.content : NULL );

    while ( node && !nodeIsHTML(node) )
        node = node->next;

    if (node == NULL)
        return NULL;

    node = node->content;
    while ( node && !nodeIsBODY(node) && !nodeIsFRAMESET(node) )
        node = node->next;

    if ( node && nodeIsFRAMESET(node) )
    {
        node = node->content;
        while ( node && !nodeIsNOFRAMES(node) )
            node = node->next;

        if ( node )
        {
            node = node->content;
            while ( node && !nodeIsBODY(node) )
                node = node->next;
        }
    }

    return node;
}